

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ethread.c
# Opt level: O0

void set_mode_estimation_done(AV1_COMP *cpi)

{
  byte bVar1;
  long lVar2;
  BLOCK_SIZE BVar3;
  int iVar4;
  long *in_RDI;
  int tplb_row;
  int mi_row;
  int tplb_cols_in_tile;
  AV1TplRowMultiThreadInfo *tpl_row_mt;
  int mi_height;
  BLOCK_SIZE bsize;
  TplParams *tpl_data;
  CommonModeInfoParams *mi_params;
  int local_34;
  int local_30;
  
  lVar2 = *in_RDI;
  BVar3 = convert_length_to_bsize((uint)*(byte *)(*in_RDI + 0xd2ad));
  bVar1 = "\x01\x02\x01\x02\x04\x02\x04\b\x04\b\x10\b\x10 \x10 \x04\x01\b\x02\x10\x04"[BVar3];
  iVar4 = (int)in_RDI[0x7833] + ((1 << (""[BVar3] & 0x1f)) >> 1) >> (""[BVar3] & 0x1f);
  local_34 = 0;
  for (local_30 = 0; local_30 < *(int *)((long)in_RDI + 0x3c194); local_30 = (uint)bVar1 + local_30)
  {
    (*(code *)in_RDI[0x13602])(lVar2 + 0x12328,local_34,iVar4 + -1,iVar4);
    local_34 = local_34 + 1;
  }
  return;
}

Assistant:

static inline void set_mode_estimation_done(AV1_COMP *cpi) {
  const CommonModeInfoParams *const mi_params = &cpi->common.mi_params;
  TplParams *const tpl_data = &cpi->ppi->tpl_data;
  const BLOCK_SIZE bsize =
      convert_length_to_bsize(cpi->ppi->tpl_data.tpl_bsize_1d);
  const int mi_height = mi_size_high[bsize];
  AV1TplRowMultiThreadInfo *const tpl_row_mt = &cpi->mt_info.tpl_row_mt;
  const int tplb_cols_in_tile =
      ROUND_POWER_OF_TWO(mi_params->mi_cols, mi_size_wide_log2[bsize]);
  // In case of tpl row-multithreading, due to top-right dependency, the worker
  // on an mb_row waits for the completion of the tpl processing of the top and
  // top-right blocks. Hence, in case a thread (main/worker) encounters an
  // error, update that the tpl processing of every mb_row in the frame is
  // complete in order to avoid dependent workers waiting indefinitely.
  for (int mi_row = 0, tplb_row = 0; mi_row < mi_params->mi_rows;
       mi_row += mi_height, tplb_row++) {
    (*tpl_row_mt->sync_write_ptr)(&tpl_data->tpl_mt_sync, tplb_row,
                                  tplb_cols_in_tile - 1, tplb_cols_in_tile);
  }
}